

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void anon_unknown.dwarf_6121::prepareEnv
               (Map<String,_String> *environment,Array<String> *envStringsBuf)

{
  Item *pIVar1;
  Item *this;
  String local_80;
  String local_58;
  
  Array<String>::reserve(envStringsBuf,environment->_size);
  pIVar1 = (environment->_end).item;
  for (this = (environment->_begin).item; this != pIVar1; this = this->next) {
    String::operator+(&local_80,&this->key,(char (*) [2])"=");
    String::operator+(&local_58,&local_80,&this->value);
    Array<String>::append(envStringsBuf,&local_58);
    String::~String(&local_58);
    String::~String(&local_80);
  }
  return;
}

Assistant:

void prepareEnv(const Map<String, String>& environment, Array<String>& envStringsBuf)
  {
    envStringsBuf.reserve(environment.size());
      for (Map<String, String>::Iterator i = environment.begin(), end = environment.end(); i != end; ++i)
        envStringsBuf.append(i.key() + "=" + *i);
  }